

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::FinishCommandList
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  string msg;
  string local_30;
  
  if ((this->m_Desc).IsDeferred == false) {
    FormatString<char[59]>
              (&local_30,(char (*) [59])"FinishCommandList() is only allowed for deferred contexts."
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x209);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = IsRecordingDeferredCommands(this);
  if (!bVar1) {
    FormatString<char[85]>
              (&local_30,
               (char (*) [85])
               "This context is not recording commands. Call Begin() before finishing the recording."
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x20a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>::operator=
            ((IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag> *)
             &this->m_DstImmediateContextId,&INVALID_CONTEXT_ID);
  (this->m_Desc).QueueType = COMMAND_QUEUE_TYPE_UNKNOWN;
  (this->m_Desc).TextureCopyGranularity[0] = 0;
  (this->m_Desc).TextureCopyGranularity[1] = 0;
  (this->m_Desc).TextureCopyGranularity[2] = 0;
  return;
}

Assistant:

void FinishCommandList()
    {
        DEV_CHECK_ERR(IsDeferred(), "FinishCommandList() is only allowed for deferred contexts.");
        DEV_CHECK_ERR(IsRecordingDeferredCommands(), "This context is not recording commands. Call Begin() before finishing the recording.");
        m_DstImmediateContextId = INVALID_CONTEXT_ID;
        m_Desc.QueueType        = COMMAND_QUEUE_TYPE_UNKNOWN;
        for (size_t i = 0; i < _countof(m_Desc.TextureCopyGranularity); ++i)
            m_Desc.TextureCopyGranularity[i] = 0;
    }